

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::iterate
          (HelperInvocationDerivateCase *this)

{
  size_type *psVar1;
  ostringstream *poVar2;
  RenderContext *renderCtx;
  TestLog *log;
  FboHelper *this_00;
  bool bVar3;
  undefined8 *puVar4;
  HelperInvocationDerivateCase *pHVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  long *plVar14;
  ulong *puVar15;
  PixelBufferAccess *dst;
  Surface *pSVar16;
  int y;
  void *__buf;
  void *__buf_00;
  ulong uVar17;
  uint uVar18;
  TestLog TVar19;
  undefined8 uVar20;
  void *pvVar21;
  int iVar22;
  int dy;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  Surface result;
  ScopedLogSection section;
  string sectionName;
  Random rnd;
  string local_2b0;
  HelperInvocationDerivateCase *local_290;
  string local_288;
  int local_264;
  int local_260;
  int local_25c;
  Surface local_258;
  TextureFormat local_238;
  RGBA local_22c;
  int local_228;
  uint local_224;
  int local_220;
  uint local_21c;
  ScopedLogSection local_218;
  long local_210;
  TestLog local_208 [2];
  string local_1f8;
  deRandom local_1d8;
  void *local_1c8 [2];
  ulong local_1b8;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  puVar4 = &local_258.m_pixels.m_cap;
  local_258._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Iteration ","");
  iVar22 = this->m_iterNdx;
  local_290 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar22 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pvVar21 = (void *)0xf;
  if ((undefined8 *)local_258._0_8_ != puVar4) {
    pvVar21 = (void *)local_258.m_pixels.m_cap;
  }
  if (pvVar21 < (void *)(local_1d8._8_8_ + (long)local_258.m_pixels.m_ptr)) {
    pvVar21 = (void *)0xf;
    if ((void **)local_1d8._0_8_ != local_1c8) {
      pvVar21 = local_1c8[0];
    }
    if (pvVar21 < (void *)(local_1d8._8_8_ + (long)local_258.m_pixels.m_ptr)) goto LAB_0060caeb;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_258._0_8_);
  }
  else {
LAB_0060caeb:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,local_1d8._0_8_);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  puVar15 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_288.field_2._M_allocated_capacity = *puVar15;
    local_288.field_2._8_8_ = puVar13[3];
  }
  else {
    local_288.field_2._M_allocated_capacity = *puVar15;
    local_288._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_288._M_string_length = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  puVar15 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_2b0.field_2._M_allocated_capacity = *puVar15;
    local_2b0.field_2._8_8_ = plVar14[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *puVar15;
    local_2b0._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_2b0._M_string_length = plVar14[1];
  *plVar14 = (long)puVar15;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,local_290->m_numIters);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar20 = (qpTestLog *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    uVar20 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (qpTestLog *)(local_210 + local_2b0._M_string_length)) {
    TVar19.m_log = (qpTestLog *)0xf;
    if (local_218.m_log != local_208) {
      TVar19.m_log = local_208[0].m_log;
    }
    if (TVar19.m_log < (qpTestLog *)(local_210 + local_2b0._M_string_length)) goto LAB_0060cc56;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_218,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_0060cc56:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_218.m_log);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  psVar1 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1f8.field_2._M_allocated_capacity = *psVar1;
    local_1f8.field_2._8_8_ = puVar13[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar1;
    local_1f8._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_1f8._M_string_length = puVar13[1];
  *puVar13 = psVar1;
  puVar13[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_218.m_log != local_208) {
    operator_delete(local_218.m_log,(ulong)((long)&(local_208[0].m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,(ulong)(local_2b0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((void **)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8[0] + 1);
  }
  if ((undefined8 *)local_258._0_8_ != puVar4) {
    operator_delete((void *)local_258._0_8_,local_258.m_pixels.m_cap + 1);
  }
  log = ((local_290->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Iter","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,local_290->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar20 = (void *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    uVar20 = local_288.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (void *)((long)local_258.m_pixels.m_ptr + local_288._M_string_length)) {
    pvVar21 = (void *)0xf;
    if ((undefined8 *)local_258._0_8_ != puVar4) {
      pvVar21 = (void *)local_258.m_pixels.m_cap;
    }
    if (pvVar21 < (void *)((long)local_258.m_pixels.m_ptr + local_288._M_string_length))
    goto LAB_0060ce20;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_258,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
  }
  else {
LAB_0060ce20:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,local_258._0_8_);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  psVar1 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0.field_2._8_8_ = puVar13[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_2b0._M_string_length = puVar13[1];
  *puVar13 = psVar1;
  puVar13[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_218,log,&local_2b0,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined8 *)local_258._0_8_ != puVar4) {
    operator_delete((void *)local_258._0_8_,local_258.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  pHVar5 = local_290;
  dVar10 = deStringHash((local_290->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus
                        ._M_p);
  uVar18 = ((uint)pHVar5->m_iterNdx >> 0x10 ^ pHVar5->m_iterNdx ^ 0x3d) * 9;
  uVar18 = (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d;
  deRandom_init(&local_1d8,uVar18 >> 0xf ^ dVar10 ^ uVar18);
  tcu::Surface::Surface(&local_258,0x100,0x100);
  FboHelper::bindForRendering
            ((local_290->m_fbo).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             .m_data.ptr);
  (**(code **)(CONCAT44(extraout_var,iVar9) + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(CONCAT44(extraout_var,iVar9) + 0x188))(0x4000);
  drawRandomPrimitives
            (renderCtx,
             (((local_290->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program,local_290->m_primitiveType,1,(Random *)&local_1d8);
  pHVar5 = local_290;
  this_00 = (local_290->m_fbo).
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
            .m_data.ptr;
  local_2b0._M_dataplus._M_p = (pointer)0x300000008;
  dst = (PixelBufferAccess *)(ulong)(uint)local_258.m_height;
  if ((void *)local_258.m_pixels.m_cap != (void *)0x0) {
    local_258.m_pixels.m_cap = (size_t)local_258.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2b0,local_258.m_width,
             local_258.m_height,1,(void *)local_258.m_pixels.m_cap);
  FboHelper::readPixels(this_00,(int)local_1b0,y,dst);
  local_238 = (TextureFormat)
              ((pHVar5->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar18 = 0xfe01;
  if (pHVar5->m_numSamples == 0) {
    uVar18 = 0x101;
  }
  if (local_258.m_height < 1) {
    iVar22 = 0;
    local_264 = 0;
    uVar17 = 0;
  }
  else {
    local_22c.m_value = uVar18 + 0x1000000;
    uVar24 = (ulong)(uVar18 | 0x1ff0000);
    uVar17 = 0;
    local_25c = 0;
    local_264 = 0;
    iVar22 = 0;
    iVar9 = local_258.m_height;
    iVar11 = local_258.m_width;
    local_1b8 = uVar24;
    do {
      if (0 < iVar11) {
        iVar9 = 0;
        do {
          uVar18 = *(uint *)((long)local_258.m_pixels.m_ptr + (long)(iVar11 * local_25c + iVar9) * 4
                            );
          bVar6 = true;
          local_260 = iVar9;
          if (uVar18 == 0xff000000) {
LAB_0060d0c4:
            local_1b0._0_8_ = CONCAT44(local_1b0._4_4_,uVar18) ^ 0xff00ff00;
            bVar7 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,(RGBA)(deUint32)uVar24);
            if ((uVar18 & 0xff0000) == 0) {
              bVar25 = false;
            }
            else {
              local_21c = (uint)uVar17;
              iVar9 = local_258.m_height;
              bVar25 = true;
              local_228 = local_258.m_width;
              iVar11 = -1;
              local_224 = uVar18;
              local_220 = iVar22;
              do {
                iVar22 = iVar11 + local_260;
                bVar3 = local_228 <= iVar22;
                iVar23 = -1;
                do {
                  if (iVar23 != 0 || iVar11 != 0) {
                    if (((bVar3 || iVar22 < 0) || (iVar12 = local_25c + iVar23, iVar12 < 0)) ||
                       (iVar9 <= iVar12)) goto LAB_0060d1ba;
                    iVar12 = *(int *)((long)local_258.m_pixels.m_ptr +
                                     (long)(iVar12 * local_258.m_width + iVar22) * 4);
                    if (iVar12 == -0x1000000) goto LAB_0060d1ba;
                    local_1b0._0_8_ = CONCAT44(local_1b0._4_4_,iVar12) ^ 0xff000000;
                    bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,local_22c);
                    if (bVar8) goto LAB_0060d1ba;
                  }
                  iVar23 = iVar23 + 1;
                } while (iVar23 != 2);
                iVar22 = iVar11 + 1;
                bVar25 = iVar11 < 1;
                iVar11 = iVar22;
              } while (iVar22 != 2);
LAB_0060d1ba:
              iVar22 = local_220 + 1;
              uVar17 = (ulong)local_21c;
              uVar24 = local_1b8;
              uVar18 = local_224;
            }
            if ((bVar6 & ((uVar18 & 0xff0000) == 0 | bVar25)) == 0 && !bVar7) {
              local_264 = local_264 + 1;
            }
            else {
              uVar17 = CONCAT71((int7)(uVar17 >> 8),(byte)uVar17 | bVar7);
            }
          }
          else {
            local_1b0._0_8_ = CONCAT44(local_1b0._4_4_,uVar18) ^ 0xff000000;
            bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,local_22c);
            if (uVar18 != 0xff00ff00) goto LAB_0060d0c4;
            uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
          }
          iVar9 = local_260 + 1;
          iVar11 = local_258.m_width;
        } while (iVar9 < local_258.m_width);
        iVar9 = local_258.m_height;
      }
      local_25c = local_25c + 1;
    } while (local_25c < iVar9);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_238.order;
  local_1b0._4_4_ = local_238.type;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Found ",6);
  std::ostream::operator<<(poVar2,iVar22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             " pixels with non-zero derivate (neighbor sample has gl_HelperInvocation = true)",0x4f)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (local_264 < 1) {
    if ((uVar17 & 1) != 0) {
      poVar2 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = local_238.order;
      local_1b0._4_4_ = local_238.type;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"All result pixels are valid",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      goto LAB_0060d5fd;
    }
    local_2b0._M_string_length = 6;
    local_2b0.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288.field_2._M_allocated_capacity = 0x6920746c75736552;
    local_288._M_string_length = 0xc;
    local_288.field_2._8_5_ = 0x6567616d;
    pSVar16 = &local_258;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2b0,&local_288,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,local_238.order,__buf_00,(size_t)pSVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_4_ = local_238.order;
    local_1b0._4_4_ = local_238.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"ERROR: Result image was empty!",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_2b0._M_string_length = 6;
    local_2b0.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288.field_2._M_allocated_capacity = 0x6920746c75736552;
    local_288._M_string_length = 0xc;
    local_288.field_2._8_5_ = 0x6567616d;
    pSVar16 = &local_258;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2b0,&local_288,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,local_238.order,__buf,(size_t)pSVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = local_238.order;
    local_1b0._4_4_ = local_238.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ERROR: Found ",0xd);
    std::ostream::operator<<(poVar2,local_264);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2," invalid result pixels!",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            ((local_290->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
             ,"Invalid pixels found");
LAB_0060d5fd:
  iVar22 = local_290->m_numIters;
  iVar9 = local_290->m_iterNdx + 1;
  local_290->m_iterNdx = iVar9;
  tcu::Surface::~Surface(&local_258);
  tcu::TestLog::endSection(local_218.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return (IterateResult)(iVar9 < iVar22);
}

Assistant:

HelperInvocationDerivateCase::IterateResult HelperInvocationDerivateCase::iterate (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const string					sectionName	= string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(m_numIters);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), (string("Iter") + de::toString(m_iterNdx)), sectionName);
	de::Random						rnd			(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	tcu::Surface					result		(FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	m_fbo->bindForRendering();
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	drawRandomPrimitives(renderCtx, m_program->getProgram(), m_primitiveType, 1, &rnd);

	m_fbo->readPixels(0, 0, result.getAccess());

	if (!verifyHelperInvocationDerivate(m_testCtx.getLog(), result, m_numSamples != 0))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixels found");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters) ? CONTINUE : STOP;
}